

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON __thiscall JSON::parse(JSON *this,InputSource *is,Reactor *reactor)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  JSON JVar1;
  undefined1 local_40d8 [8];
  JSONParser jp;
  Reactor *reactor_local;
  InputSource *is_local;
  
  jp.dict_key_offset = (qpdf_offset_t)reactor;
  anon_unknown.dwarf_3abaf::JSONParser::JSONParser((JSONParser *)local_40d8,is,reactor);
  anon_unknown.dwarf_3abaf::JSONParser::parse((JSONParser *)this);
  anon_unknown.dwarf_3abaf::JSONParser::~JSONParser((JSONParser *)local_40d8);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::parse(InputSource& is, Reactor* reactor)
{
    JSONParser jp(is, reactor);
    return jp.parse();
}